

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmFormatter::buffer_expchar(CVmFormatter *this,wchar_t c)

{
  wchar_t *pwVar1;
  bool bVar2;
  byte flags;
  os_color_t oVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  wchar_t *pwVar10;
  ulong uVar11;
  size_t __n;
  ushort uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  wchar_t *__s;
  wchar_t wVar17;
  vm_nl_type nl;
  int wid;
  vmcon_color_t *__src;
  uchar *__src_00;
  uchar tmpflags [2048];
  wchar_t tmpbuf [2048];
  vmcon_color_t tmpcolor [2048];
  undefined1 local_e838 [2048];
  undefined1 local_e038 [8192];
  undefined1 local_c038 [49160];
  
  bVar15 = this->cur_flags_;
  if ((this->field_0xef81 & 0x40) == 0) {
    wid = 1;
    bVar16 = 0;
    if (c < L'\x2002') {
      if (c != L'\x15') {
        if (c == L'\xa0') goto switchD_00272365_caseD_4;
        if (c == L'­') {
          if ((long)this->linepos_ == 0) {
            return;
          }
          this->flagbuf_[(long)this->linepos_ + -1] = this->flagbuf_[(long)this->linepos_ + -1] | 8;
          return;
        }
        goto LAB_00272585;
      }
switchD_00272332_caseD_2005:
    }
    else {
      switch(c) {
      case L'\x2002':
      case L'\x2004':
        wid = 2;
        break;
      case L'\x2003':
        wid = 3;
        break;
      case L'\x2005':
      case L'\x2006':
      case L'\x2007':
      case L'\x2009':
        goto switchD_00272332_caseD_2005;
      case L'\x2008':
      case L'\x200a':
      case L'\x200b':
        if ((long)this->linepos_ == 0) {
          return;
        }
        this->flagbuf_[(long)this->linepos_ + -1] = this->flagbuf_[(long)this->linepos_ + -1] & 0xfe
        ;
        this->flagbuf_[(long)this->linepos_ + -1] = this->flagbuf_[(long)this->linepos_ + -1] | 2;
        return;
      default:
        if (c == L'\xfeff') {
          if ((long)this->linepos_ == 0) {
            return;
          }
          this->flagbuf_[(long)this->linepos_ + -1] = this->flagbuf_[(long)this->linepos_ + -1] | 1;
          return;
        }
LAB_00272585:
        iVar5 = t3_get_chartype(c);
        bVar16 = 0;
        if (iVar5 == 6) {
          bVar16 = 0 < this->html_pre_level_ | this->field_0xef81 & 1;
          c = L' ';
        }
        goto switchD_00272365_caseD_4;
      }
    }
    c = L' ';
    bVar16 = 1;
  }
  else {
    wid = 1;
    bVar16 = 0;
    switch(this->html_passthru_state_) {
    case VMCON_HPS_NORMAL:
    case VMCON_HPS_MARKUP_END:
      if (c == L'<') {
        this->html_passthru_tagp_ = this->html_passthru_tag_;
        this->html_passthru_state_ = VMCON_HPS_TAG_START;
        c = L'<';
      }
      else {
        if (c != L'&') goto LAB_00272789;
        this->html_passthru_state_ = VMCON_HPS_ENTITY_1ST;
        c = L'&';
      }
      break;
    case VMCON_HPS_TAG_START:
      if (c == L'/') {
        pcVar8 = this->html_passthru_tagp_;
        if (pcVar8 == this->html_passthru_tag_) {
          this->html_passthru_tagp_ = pcVar8 + 1;
          *pcVar8 = '/';
          c = L'/';
        }
        else {
LAB_00272789:
          this->html_passthru_state_ = VMCON_HPS_NORMAL;
        }
      }
      else {
        if (0x19 < (uint)((c & 0xffffffdfU) - 0x41U)) {
          if ((uint)c < 0x21) {
            uVar11 = (ulong)(uint)c;
            uVar13 = 0x100002600;
LAB_00272783:
            if ((uVar13 >> (uVar11 & 0x3f) & 1) != 0) break;
          }
          goto LAB_00272789;
        }
        this->html_passthru_state_ = VMCON_HPS_TAG_NAME;
        pcVar8 = this->html_passthru_tagp_;
LAB_002725fd:
        this->html_passthru_tagp_ = pcVar8 + 1;
        *pcVar8 = (char)c;
      }
      break;
    case VMCON_HPS_TAG_NAME:
      pcVar8 = this->html_passthru_tagp_;
      if (0x19 < (uint)((c & 0xffffffdfU) - 0x41U)) {
        *pcVar8 = '\0';
        this->html_passthru_state_ = VMCON_HPS_TAG;
        goto switchD_00272365_caseD_3;
      }
      if ((long)(pcVar8 + (-0xef8c - (long)this)) < 0x1f) goto LAB_002725fd;
      break;
    case VMCON_HPS_TAG:
switchD_00272365_caseD_3:
      if (c < L'/') {
        if (c == L'\"') {
          this->html_passthru_state_ = VMCON_HPS_DQUOTE;
          goto LAB_00272726;
        }
        if (c == L'\'') {
          this->html_passthru_state_ = VMCON_HPS_SQUOTE;
          goto LAB_00272662;
        }
      }
      else if (c == L'/') {
        pcVar8 = this->html_passthru_tagp_;
        c = L'/';
        if (((pcVar8 != this->html_passthru_tag_) &&
            ((long)pcVar8 - (long)this->html_passthru_tag_ < 0x1f)) && (pcVar8[-1] != '/')) {
          this->html_passthru_tagp_ = pcVar8 + 1;
          *pcVar8 = '/';
          *this->html_passthru_tagp_ = '\0';
        }
      }
      else if (c == L'>') {
        this->html_passthru_state_ = VMCON_HPS_MARKUP_END;
        iVar5 = stricmp(this->html_passthru_tag_,"pre");
        if (iVar5 == 0) {
          this->html_pre_level_ = this->html_pre_level_ + 1;
          c = L'>';
        }
        else {
          iVar5 = stricmp(this->html_passthru_tag_,"/pre");
          c = L'>';
          if ((iVar5 == 0) && (this->html_pre_level_ != 0)) {
            this->html_pre_level_ = this->html_pre_level_ + -1;
          }
        }
      }
      break;
    case VMCON_HPS_SQUOTE:
      if (c == L'\'') {
        this->html_passthru_state_ = VMCON_HPS_TAG;
LAB_00272662:
        c = L'\'';
      }
      break;
    case VMCON_HPS_DQUOTE:
      if (c == L'\"') {
        this->html_passthru_state_ = VMCON_HPS_TAG;
LAB_00272726:
        c = L'\"';
      }
      break;
    case VMCON_HPS_ENTITY_1ST:
      if (c == L'#') {
        this->html_passthru_state_ = VMCON_HPS_ENTITY_NUM_1ST;
        c = L'#';
      }
      else {
        if (0x19 < (uint)((c & 0xffffffdfU) - 0x41U)) goto LAB_00272789;
        this->html_passthru_state_ = VMCON_HPS_ENTITY_NAME;
      }
      break;
    case VMCON_HPS_ENTITY_NUM_1ST:
      if ((c & 0xffffffdfU) == 0x58) {
        this->html_passthru_state_ = VMCON_HPS_ENTITY_HEX;
      }
      else {
        if (9 < (uint)(c + L'\xffffffd0')) goto LAB_00272789;
        this->html_passthru_state_ = VMCON_HPS_ENTITY_DEC;
      }
      break;
    case VMCON_HPS_ENTITY_HEX:
      if (c == L';') {
LAB_0027253c:
        this->html_passthru_state_ = VMCON_HPS_MARKUP_END;
        c = L';';
      }
      else if ((uint)(c + L'\xffffffc6') < 0xfffffff6) {
        uVar11 = (ulong)(uint)(c + L'\xffffffbf');
        if ((uint)(c + L'\xffffffbf') < 0x26) {
          uVar13 = 0x3f0000003f;
          goto LAB_00272783;
        }
        goto LAB_00272789;
      }
      break;
    case VMCON_HPS_ENTITY_DEC:
      if (c == L';') goto LAB_0027253c;
      if ((uint)(c + L'\xffffffc6') < 0xfffffff6) goto LAB_00272789;
      break;
    case VMCON_HPS_ENTITY_NAME:
      if (c == L';') goto LAB_0027253c;
      if (((uint)(c + L'\xffffffc6') < 0xfffffff6) &&
         ((uint)((c & 0xffffffdfU) - 0x5bU) < 0xffffffe6)) goto LAB_00272789;
    }
  }
switchD_00272365_caseD_4:
  flags = bVar15 | 0x10;
  if (bVar16 == 0) {
    flags = bVar15;
  }
  if (this->html_passthru_state_ == VMCON_HPS_NORMAL) {
    uVar12 = *(ushort *)&this->field_0xef81;
    if ((uVar12 & 0x14) != 0) {
      iVar5 = t3_get_chartype(c);
      uVar12 = *(ushort *)&this->field_0xef81;
      if (0xfffffffb < iVar5 - 5U) {
        *(ushort *)&this->field_0xef81 = uVar12 & 0xfffb;
        if ((uVar12 & 0x10) == 0) {
          pwVar10 = t3_to_title(c);
        }
        else {
          pwVar10 = t3_to_upper(c);
        }
        if (((pwVar10 != (wchar_t *)0x0) && (wVar17 = *pwVar10, wVar17 != L'\0')) &&
           (c = wVar17, pwVar10[1] != L'\0')) {
          do {
            pwVar10 = pwVar10 + 1;
            buffer_char(this,wVar17);
            wVar17 = *pwVar10;
          } while (wVar17 != L'\0');
          return;
        }
        goto LAB_002727b2;
      }
    }
    if (((uVar12 & 8) != 0) && (iVar5 = t3_get_chartype(c), 0xfffffffb < iVar5 - 5U)) {
      this->field_0xef81 = this->field_0xef81 & 0xf7;
      pwVar10 = t3_to_lower(c);
      if ((pwVar10 != (wchar_t *)0x0) &&
         ((wVar17 = *pwVar10, wVar17 != L'\0' && (c = wVar17, pwVar10[1] != L'\0')))) {
        do {
          pwVar10 = pwVar10 + 1;
          buffer_char(this,wVar17);
          wVar17 = *pwVar10;
        } while (wVar17 != L'\0');
        return;
      }
    }
  }
LAB_002727b2:
  iVar5 = this->linecol_;
  if ((c == L' ') && (this->html_pre_level_ == 0)) {
    if (iVar5 == 0 && bVar16 == 0) {
      return;
    }
    if (0 < this->linepos_) {
      uVar6 = this->linepos_ - 1;
      if ((bVar16 == 0) && (this->linebuf_[uVar6] == L' ')) {
        return;
      }
      if (((bVar16 != 0) && (this->linebuf_[uVar6] == L' ')) &&
         ((this->flagbuf_[uVar6] & 0x10) == 0)) {
        this->linepos_ = uVar6;
        iVar5 = iVar5 + -1;
        this->linecol_ = iVar5;
      }
    }
  }
  iVar7 = (*this->_vptr_CVmFormatter[0xe])(this);
  if (iVar7 <= iVar5 + wid) {
    pwVar10 = this->linebuf_;
    lVar9 = (long)this->linepos_;
    if (c == L' ') {
      if (this->linebuf_[lVar9 + -1] != L' ') {
        this->linebuf_[lVar9] = L' ';
        this->flagbuf_[this->linepos_] = flags;
        iVar5 = this->linepos_;
        uVar4 = *(undefined4 *)&(this->cur_color_).field_0x14;
        this->colorbuf_[iVar5].attr = (this->cur_color_).attr;
        *(undefined4 *)&this->colorbuf_[iVar5].field_0x14 = uVar4;
        oVar3 = (this->cur_color_).bg;
        this->colorbuf_[iVar5].fg = (this->cur_color_).fg;
        this->colorbuf_[iVar5].bg = oVar3;
        this->linepos_ = this->linepos_ + 1;
      }
      this->linecol_ = this->linecol_ + wid;
      return;
    }
    this->linebuf_[lVar9] = c;
    this->flagbuf_[this->linepos_] = this->cur_flags_;
    if ((this->field_0xef82 & 1) == 0) {
      uVar6 = this->linepos_;
      uVar11 = (ulong)(int)uVar6;
      if (-1 < (long)uVar11) {
        uVar13 = uVar11;
LAB_00272955:
        if (uVar13 != 0) {
          bVar15 = this->flagbuf_[uVar13 - 1];
          if ((bVar15 & 1) == 0) goto LAB_00272971;
          goto LAB_002729e7;
        }
        bVar15 = 0;
LAB_00272971:
        bVar2 = true;
        if ((((bVar15 & 2) == 0) && ((this->flagbuf_[uVar13] & 4) == 0)) &&
           ((uVar13 == 0 || ((bVar15 & 4) == 0)))) {
          if ((bVar15 >> 3 & uVar13 != 0 & (long)uVar13 < (long)uVar11) != 0) {
            bVar2 = false;
            goto LAB_00272aaf;
          }
          if (pwVar10[uVar13] == L' ') goto LAB_00272aaf;
          if (uVar13 == 0) goto LAB_002729f5;
          if (this->linebuf_[uVar13 - 1] == L'-') {
            if (pwVar10[uVar13] == L'-') goto LAB_002729e7;
            goto LAB_00272aaf;
          }
          if (this->linebuf_[uVar13 - 1] == L' ') goto LAB_00272aaf;
LAB_002729e7:
          uVar6 = uVar6 - 1;
          bVar2 = (long)uVar13 < 1;
          uVar13 = uVar13 - 1;
          if (bVar2) goto LAB_002729f5;
          goto LAB_00272955;
        }
LAB_00272aaf:
        this->linebuf_[uVar11] = L'\0';
        __s = this->linebuf_ + ((ulong)uVar6 - 1);
        __src = this->colorbuf_ + ((ulong)uVar6 - 1);
        __src_00 = this->flagbuf_ + ((ulong)uVar6 - 1);
        do {
          __src = __src + 1;
          __src_00 = __src_00 + 1;
          pwVar1 = __s + 1;
          __s = __s + 1;
        } while (*pwVar1 == L' ');
        __n = wcslen(__s);
        memcpy(local_e038,__s,__n * 4);
        memcpy(local_c038,__src,__n * 0x18);
        memcpy(local_e838,__src_00,__n);
        if (!bVar2) {
          pwVar10[uVar13 & 0xffffffff] = L'-';
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        uVar11 = uVar13 & 0xffffffff;
        while (uVar14 = uVar11, 0 < (int)uVar14) {
          if ((this->linebuf_[uVar14 - 1] != L' ') ||
             (uVar11 = uVar14 - 1, (this->flagbuf_[uVar14 - 1] & 1) != 0)) goto LAB_00272bd6;
        }
        uVar14 = (ulong)((int)(uint)uVar13 >> 0x1f & (uint)uVar13);
LAB_00272bd6:
        this->linebuf_[uVar14 & 0xffffffff] = L'\0';
        flush(this,((*(ushort *)&this->field_0xef81 >> 8 & 1) != 0) + VM_NL_NEWLINE);
        memcpy(pwVar10,local_e038,__n * 4);
        memcpy(this->colorbuf_,local_c038,__n * 0x18);
        memcpy(this->flagbuf_,local_e838,__n);
        this->linepos_ = (int)__n;
        this->linecol_ = (int)__n;
        goto LAB_00272c3f;
      }
LAB_002729f5:
      iVar5 = (*this->console_->_vptr_CVmConsole[7])();
      if ((iVar5 != 0) && (this->linepos_ < 0x7ff)) goto LAB_00272c3f;
      nl = ((byte)this->field_0xef82 & 1) * 2 + VM_NL_NEWLINE;
    }
    else {
      nl = VM_NL_NONE_INTERNAL;
    }
    flush(this,nl);
    this->linepos_ = 0;
    this->linecol_ = 0;
    this->linebuf_[0] = L'\0';
    this->is_continuation_ = 0;
  }
LAB_00272c3f:
  buffer_rendered(this,c,flags,wid);
  return;
}

Assistant:

void CVmFormatter::buffer_expchar(VMG_ wchar_t c)
{
    /* presume the character takes up only one column */
    int cwid = 1;

    /* presume we'll use the current flags for the new character */
    unsigned char cflags = cur_flags_;

    /* assume it's not a quoted space */
    int qspace = FALSE;

    /* 
     *   Check for some special characters.
     *   
     *   If we have an underlying HTML renderer, keep track of the HTML
     *   lexical state, so we know if we're in a tag or in ordinary text.  We
     *   can pass through all of the special line-breaking and spacing
     *   characters to the underlying HTML renderer.
     *   
     *   If our underlying renderer is a plain text renderer, we actually
     *   parse the HTML ourselves, so HTML tags will never make it this far -
     *   the caller will already have interpreted any HTML tags and removed
     *   them from the text stream, passing only the final plain text to us.
     *   However, with a plain text renderer, we have to do all of the work
     *   of line breaking, so we must look at the special spacing and
     *   line-break control characters.  
     */
    if (html_target_)
    {
        /* 
         *   track the lexical state of the HTML stream going to the
         *   underlying renderer 
         */
        switch (html_passthru_state_)
        {
        case VMCON_HPS_MARKUP_END:
        case VMCON_HPS_NORMAL:
            /* check to see if we're starting a markup */
            if (c == '&')
                html_passthru_state_ = VMCON_HPS_ENTITY_1ST;
            else if (c == '<')
            {
                html_passthru_tagp_ = html_passthru_tag_;
                html_passthru_state_ = VMCON_HPS_TAG_START;
            }
            else
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_1ST:
            /* check to see what kind of entity we have */
            if (c == '#')
                html_passthru_state_ = VMCON_HPS_ENTITY_NUM_1ST;
            else if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
                html_passthru_state_ = VMCON_HPS_ENTITY_NAME;
            else
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_NUM_1ST:
            /* check to see what kind of number we have */
            if (c == 'x' || c == 'X')
                html_passthru_state_ = VMCON_HPS_ENTITY_HEX;
            else if (c >= '0' && c <= '9')
                html_passthru_state_ = VMCON_HPS_ENTITY_DEC;
            else
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_HEX:
            /* see if we're done with hex digits */
            if (c == ';')
                html_passthru_state_ = VMCON_HPS_MARKUP_END;
            else if ((c < '0' || c > '9')
                     && (c < 'a' || c > 'f')
                     && (c < 'A' || c > 'F'))
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_DEC:
            /* see if we're done with decimal digits */
            if (c == ';')
                html_passthru_state_ = VMCON_HPS_MARKUP_END;
            else if (c < '0' || c > '9')
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_NAME:
            /* see if we're done with alphanumerics */
            if (c == ';')
                html_passthru_state_ = VMCON_HPS_MARKUP_END;
            else if ((c < 'a' || c > 'z')
                     && (c < 'A' || c > 'Z')
                     && (c < '0' || c > '9'))
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_TAG_START:
            /* start of a tag, before the name - check for the name start */
            if (c == '/' && html_passthru_tagp_ == html_passthru_tag_)
            {
                /* 
                 *   note the initial '/', but stay in TAG_START state, so
                 *   that we skip any spaces between the '/' and the tag name
                 */
                *html_passthru_tagp_++ = '/';
            }
            else if ((c >= 'a' && c <= 'z')
                     || (c >= 'A' && c <= 'Z'))
            {
                /* start of the tag name */
                html_passthru_state_ = VMCON_HPS_TAG_NAME;
                *html_passthru_tagp_++ = (char)c;
            }
            else if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
            {
                /* 
                 *   ignore whitespace between '<' and the tag name - simply
                 *   stay in TAG_START mode 
                 */
            }
            else
            {
                /* anything else is invalid - must not be a tag after all */
                html_passthru_state_ = VMCON_HPS_NORMAL;
            }
            break;

        case VMCON_HPS_TAG_NAME:
            /* tag name - check for continuation */
            if ((c >= 'a' && c <= 'z')
                || (c >= 'A' && c <= 'Z'))
            {
                /* gather the tag name if it fits */
                if (html_passthru_tagp_ - html_passthru_tag_ + 1
					< (ptrdiff_t)sizeof(html_passthru_tag_))
                    *html_passthru_tagp_++ = (char)c;
            }
            else
            {
                /* end of the tag name */
                *html_passthru_tagp_ = '\0';
                html_passthru_state_ = VMCON_HPS_TAG;
                goto do_tag;
            }
            break;

        case VMCON_HPS_TAG:
            do_tag:
            /* see if we're done with the tag, or entering quoted material */
            if (c == '>')
            {
                /* switch to end of markup mode */
                html_passthru_state_ = VMCON_HPS_MARKUP_END;

                /* note if entering or exiting a PRE tag */
                if (stricmp(html_passthru_tag_, "pre") == 0)
                    ++html_pre_level_;
                else if (stricmp(html_passthru_tag_, "/pre") == 0
                         && html_pre_level_ != 0)
                    --html_pre_level_;
            }
            else if (c == '/'
                     && html_passthru_tagp_ != html_passthru_tag_
                     && *(html_passthru_tagp_ - 1) != '/')
            {
                /* add the '/' to the end of the tag name */
                if (html_passthru_tagp_ - html_passthru_tag_ + 1
					< (ptrdiff_t)sizeof(html_passthru_tag_))
                {
                    *html_passthru_tagp_++ = (char)c;
                    *html_passthru_tagp_ = '\0';
                }
            }
            else if (c == '"')
                html_passthru_state_ = VMCON_HPS_DQUOTE;
            else if (c == '\'')
                html_passthru_state_ = VMCON_HPS_SQUOTE;
            break;

        case VMCON_HPS_SQUOTE:
            /* see if we're done with the quoted material */
            if (c == '\'')
                html_passthru_state_ = VMCON_HPS_TAG;
            break;

        case VMCON_HPS_DQUOTE:
            /* see if we're done with the quoted material */
            if (c == '"')
                html_passthru_state_ = VMCON_HPS_TAG;
            break;

        default:
            /* ignore other states */
            break;
        }
    }
    else
    {
        /* check for special characters */
        switch(c)
        {
        case 0x00AD:
            /*
             *   The Unicode "soft hyphen" character.  This indicates a
             *   point at which we can insert a hyphen followed by a soft
             *   line break, if it's a convenient point to break the line;
             *   if we don't choose to break the line here, the soft hyphen
             *   is invisible.  
             *   
             *   Don't buffer anything at all; instead, just flag the
             *   preceding character as being a soft hyphenation point, so
             *   that we can insert a hyphen there when we get around to
             *   breaking the line.  
             */
            if (linepos_ != 0)
                flagbuf_[linepos_ - 1] |= VMCON_OBF_SHY;

            /* we don't need to buffer anything, so we're done */
            return;

        case 0xFEFF:
            /*
             *   The Unicode zero-width non-breaking space.  This indicates
             *   a point at which we cannot break the line, even if we could
             *   normally break here.  Flag the preceding character as a
             *   non-breaking point.  Don't buffer anything for this
             *   character, as it's not rendered; it merely controls line
             *   breaking.  
             */
            if (linepos_ != 0)
                flagbuf_[linepos_ - 1] |= VMCON_OBF_NOBREAK;

            /* we don't buffer anything, so we're done */
            return;

        case 0x200B:                                    /* zero-width space */
        case 0x200a:                                          /* hair space */
        case 0x2008:                                   /* punctuation space */
            /* 
             *   Zero-width space: This indicates an explicitly allowed
             *   line-breaking point, but is rendered as invisible.  Flag the
             *   preceding character as an OK-to-break point, but don't
             *   buffer anything, as the zero-width space isn't rendered.  
             *   
             *   Hair and punctuation spaces: Treat these very thin spaces as
             *   invisible in a fixed-width font.  These are normally used
             *   for subtle typographical effects in proportionally-spaced
             *   fonts; for example, for separating a right single quote from
             *   an immediately following right double quote (as in a
             *   quotation within a quotation: I said, "type 'quote'").  When
             *   translating to fixed-pitch type, these special spacing
             *   effects aren't usually necessary or desirable because of the
             *   built-in space in every character cell.
             *   
             *   These spaces cancel any explicit non-breaking flag that
             *   precedes them, since they cause the flag to act on the
             *   space's left edge, while leaving the right edge open for
             *   breaking.  Since we don't actually take up any buffer space,
             *   push our right edge's breakability back to the preceding
             *   character.  
             */
            if (linepos_ != 0)
            {
                flagbuf_[linepos_ - 1] &= ~VMCON_OBF_NOBREAK;
                flagbuf_[linepos_ - 1] |= VMCON_OBF_OKBREAK;
            }

            /* we don't buffer anything, so we're done */
            return;

        case 0x00A0:
            /* non-breaking space - buffer it as given */
            break;
            
        case 0x0015:             /* special internal quoted space character */
        case 0x2005:                                   /* four-per-em space */
        case 0x2006:                                    /* six-per-em space */
        case 0x2007:                                        /* figure space */
        case 0x2009:                                          /* thin space */
            /* 
             *   Treat all of these as non-combining spaces, and render them
             *   all as single ordinary spaces.  In text mode, we are
             *   limited to a monospaced font, so we can't render any
             *   differences among these various thinner-than-normal spaces.
             */
            qspace = TRUE;
            c = ' ';
            break;

        case 0x2002:                                            /* en space */
        case 0x2004:                                  /* three-per-em space */
            /* 
             *   En space, three-per-em space - mark these as non-combining,
             *   and render them as a two ordinary spaces.  In the case of
             *   an en space, we really do want to take up the space of two
             *   ordinary spaces; for a three-per-em space, we want about a
             *   space and a half, but since we're dealing with a monospaced
             *   font, we have to round up to a full two spaces.  
             */
            qspace = TRUE;
            cwid = 2;
            c = ' ';
            break;
            
        case 0x2003:
            /* em space - mark it as non-combining */
            qspace = TRUE;
            
            /* render this as three ordinary spaces */
            cwid = 3;
            c = ' ';
            break;

        default:
            /* 
             *   Translate any horizontal whitespace character to a regular
             *   space character.  Note that, once this is done, we don't
             *   need to worry about calling t3_is_space() any more - we can
             *   just check that we have a regular ' ' character.  
             */
            if (t3_is_space(c))
            {
                /* convert it to an ordinary space */
                c = ' ';
                
                /* if we're in obey-whitespace mode, quote the space */
                qspace = obey_whitespace_ || html_pre_level_ > 0;
            }
            break;
        }
    }

    /* if it's a quoted space, mark it as such in the buffer flags */
    if (qspace)
        cflags |= VMCON_OBF_QSPACE;

    /* 
     *   Check for the caps/nocaps flags - but only if our HTML lexical state
     *   in the underlying text stream is plain text, because we don't want
     *   to apply these flags to alphabetic characters that are inside tag or
     *   entity text.  
     */
    if (html_passthru_state_ == VMCON_HPS_NORMAL)
    {
        if ((capsflag_ || allcapsflag_) && t3_is_alpha(c))
        {
            /* 
             *   capsflag or allcapsflag is set, so render this character in
             *   title case or upper case, respectively.  For the ordinary
             *   capsflag, use title case rather than upper case, since
             *   capsflag conceptually only applies to a single letter, and
             *   some Unicode characters represent ligatures of multiple
             *   letters.  In such cases we only want to capitalize the first
             *   letter in the ligature, which is exactly what we get when we
             *   convert it to the title case.
             *   
             *   Start by consuming the capsflag. 
             */
            capsflag_ = FALSE;

            /* get the appropriate expansion */
            const wchar_t *u = allcapsflag_ ? t3_to_upper(c) : t3_to_title(c);

            /*
             *   If there's no expansion, continue with the original
             *   character.  If it's a single-character expansion, continue
             *   with the replacement character.  If it's a 1:N expansion,
             *   recursively buffer the expansion. 
             */
            if (u != 0 && u[0] != 0)
            {
                if (u[1] != 0)
                {
                    /* 1:N expansion - handle it recursively */
                    buffer_wstring(vmg_ u);
                    return;
                }
                else
                {
                    /* 1:1 expansion - continue with the new character */
                    c = u[0];
                }
            }
        }
        else if (nocapsflag_ && t3_is_alpha(c))
        {
            /* lower-casing the character - consume the flag */
            nocapsflag_ = FALSE;

            /* get the expansion */
            const wchar_t *l = t3_to_lower(c);

            /* 
             *   recursively handle 1:N expansions; otherwise continue with
             *   the replacement character, if there is one 
             */
            if (l != 0 && l[0] != 0)
            {
                if (l[1] != 0)
                {
                    /* 1:N expansion - handle it recursively */
                    buffer_wstring(vmg_ l);
                    return;
                }
                else
                {
                    /* 1:1 expansion - continue with the new character */
                    c = l[0];
                }
            }
        }
    }

    /*
     *   If this is a space of some kind, we might be able to consolidate it
     *   with a preceding character.  If the display layer is an HTML
     *   renderer, pass spaces through intact, and let the HTML parser handle
     *   whitespace compression.
     */
    if (c == ' ' && html_pre_level_ == 0)
    {
        /* ignore ordinary whitespace at the start of a line */
        if (linecol_ == 0 && !qspace)
            return;

        /* 
         *   Consolidate runs of whitespace.  Ordinary whitespace is
         *   subsumed into any type of quoted spaces, but quoted spaces do
         *   not combine.  
         */
        if (linepos_ > 0)
        {
            wchar_t prv;

            /* get the previous character */
            prv = linebuf_[linepos_ - 1];
            
            /* 
             *   if the new character is an ordinary (combining) whitespace
             *   character, subsume it into any preceding space character 
             */
            if (!qspace && prv == ' ')
                return;

            /* 
             *   if the new character is a quoted space, and the preceding
             *   character is a non-quoted space, subsume the preceding
             *   space into the new character 
             */
            if (qspace
                && prv == ' '
                && !(flagbuf_[linepos_ - 1] & VMCON_OBF_QSPACE))
            {
                /* remove the preceding ordinary whitespace */
                --linepos_;
                --linecol_;
            }
        }
    }

    /* if the new character fits in the line, add it */
    if (linecol_ + cwid < get_buffer_maxcol())
    {
        /* buffer this character */
        buffer_rendered(c, cflags, cwid);

        /* we're finished processing the character */
        return;
    }

    /*
     *   The line would overflow if this character were added.
     *   
     *   If we're trying to output any kind of breakable space, just add it
     *   to the line buffer for now; we'll come back later and figure out
     *   where to break upon buffering the next non-space character.  This
     *   ensures that we don't carry trailing space (even trailing en or em
     *   spaces) to the start of the next line if we have an explicit
     *   newline before the next non-space character.  
     */
    if (c == ' ')
    {
        /* 
         *   We're adding a space, so we'll figure out the breaking later,
         *   when we output the next non-space character.  If the preceding
         *   character is any kind of space, don't bother adding the new
         *   one, since any contiguous whitespace at the end of the line has
         *   no effect on the line's appearance.  
         */
        if (linebuf_[linepos_ - 1] == ' ')
        {
            /* 
             *   We're adding a space to a line that already ends in a
             *   space, so we don't really need to add the character.
             *   However, reflect the virtual addition in the output column
             *   position, since the space does affect our column position.
             *   We know that we're adding the new space even though we have
             *   a space preceding, since we wouldn't have gotten this far
             *   if we were going to collapse the space with a run of
             *   whitespace. 
             */
        }
        else
        {
            /* the line doesn't already end in space, so add the space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cflags;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer */
            ++linepos_;
        }

        /* 
         *   Adjust the column position for the added space.  Note that we
         *   adjust by the rendered width of the new character even though
         *   we actually added only one character; we only add one character
         *   to the buffer to avoid buffer overflow, but the column position
         *   needs adjustment by the full rendered width.  The fact that the
         *   actual buffer size and rendered width no longer match isn't
         *   important because the difference is entirely in invisible
         *   whitespace at the right end of the line.  
         */
        linecol_ += cwid;

        /* done for now */
        return;
    }
    
    /*
     *   We're adding something other than an ordinary space to the line,
     *   and the new character won't fit, so we must find an appropriate
     *   point to break the line. 
     *   
     *   First, add the new character to the buffer - it could be
     *   significant in how we calculate the break position.  (Note that we
     *   allocate the buffer with space for one extra character after
     *   reaching the maximum line width, so we know we have room for this.)
     */
    linebuf_[linepos_] = c;
    flagbuf_[linepos_] = cur_flags_;

    /* 
     *   if the underlying OS layer is doing the line wrapping, just flush
     *   out the buffer; don't bother trying to do any line wrapping
     *   ourselves, since this work would just be redundant with what the OS
     *   layer has to do anyway 
     */
    if (os_line_wrap_)
    {
        /* flush the line, adding no padding after it */
        flush_line(vmg_ FALSE);

        /* 
         *   we've completely cleared out the line buffer, so reset all of
         *   the line buffer counters 
         */
        linepos_ = 0;
        linecol_ = 0;
        linebuf_[0] = '\0';
        is_continuation_ = FALSE;

        /* we're done */
        goto done_with_wrapping;
    }

    /*
     *   Scan backwards, looking for a break position.  Start at the current
     *   column: we know we can fit everything up to this point on a line on
     *   the underlying display, so this is the rightmost possible position
     *   at which we could break the line.  Keep going until we find a
     *   breaking point or reach the left edge of the line.  
     */
    int shy, i;
    for (i = linepos_, shy = FALSE ; i >= 0 ; --i)
    {
        unsigned char f;
        unsigned char prvf;
        
        /* 
         *   There are two break modes: word-break mode and break-anywhere
         *   mode.  The modes are applied to each character, via the buffer
         *   flags.
         *   
         *   In word-break mode, we can break at any ordinary space, at a
         *   soft hyphen, just after a regular hyphen, or at any explicit
         *   ok-to-break point; but we can't break after any character
         *   marked as a no-break point.
         *   
         *   In break-anywhere mode, we can break between any two
         *   characters, except that we can't break after any character
         *   marked as a no-break point.  
         */

        /* get the current character's flags */
        f = flagbuf_[i];

        /* get the preceding character's flags */
        prvf = (i > 0 ? flagbuf_[i-1] : 0);

        /* 
         *   if the preceding character is marked as a no-break point, we
         *   definitely can't break here, so keep looking 
         */
        if ((prvf & VMCON_OBF_NOBREAK) != 0)
            continue;

        /* 
         *   if the preceding character is marked as an explicit ok-to-break
         *   point, we definitely can break here 
         */
        if ((prvf & VMCON_OBF_OKBREAK) != 0)
            break;

        /* 
         *   If the current character is in a run of break-anywhere text,
         *   then we can insert a break just before the current character.
         *   Likewise, if the preceding character is in a run of
         *   break-anywhere text, we can break just after the preceding
         *   character, which is the same as breaking just before the
         *   current character.
         *   
         *   Note that we must test for both cases to properly handle
         *   boundaries between break-anywhere and word-break text.  If
         *   we're switching from word-break to break-anywhere text, the
         *   current character will be marked as break-anywhere, so if we
         *   only tested the previous character, we'd miss this transition.
         *   If we're switching from break-anywhere to word-break text, the
         *   previous character will be marked as break-anywhere, so we'd
         *   miss the fact that we could break right here (rather than
         *   before the previous character) if we didn't test it explicitly.
         */
        if ((f & VMCON_OBF_BREAK_ANY) != 0
            || (i > 0 && (prvf & VMCON_OBF_BREAK_ANY) != 0))
            break;

        /* 
         *   If the preceding character is marked as a soft hyphenation
         *   point, and we're not at the rightmost position, we can break
         *   here with hyphenation.  We can't break with hyphenation at the
         *   last position because hyphenation requires us to actually
         *   insert a hyphen character, and we know that at the last
         *   position we don't have room for inserting another character.  
         */
        if (i > 0 && i < linepos_ && (prvf & VMCON_OBF_SHY) != 0)
        {
            /* note that we're breaking at a soft hyphen */
            shy = TRUE;

            /* we can break here */
            break;
        }

        /* 
         *   we can break to the left of a space (i.e., we can break before
         *   the current character if the current character is a space) 
         */
        if (linebuf_[i] == ' ')
            break;

        /* 
         *   We can also break to the right of a space.  We need to check
         *   for this case separately from checking that the current
         *   charatcer is a space (which breaks to the left of the space),
         *   because we could have a no-break marker on one side of the
         *   space but not on the other side.  
         */
        if (i > 0 && linebuf_[i-1] == ' ')
            break;

        /* 
         *   If we're to the right of a hyphen, we can break here.  However,
         *   don't break in the middle of a set of consecutive hyphens
         *   (i.e., we don't want to break up "--" sequences).
         */
        if (i > 0 && linebuf_[i-1] == '-' && linebuf_[i] != '-')
            break;
    }
    
    /* check to see if we found a good place to break */
    if (i < 0)
    {
        /*
         *   We didn't find a good place to break.  If the underlying
         *   console allows overrunning the line width, simply add the
         *   character, even though it overflows; otherwise, force a break
         *   at the line width, even though it doesn't occur at a natural
         *   breaking point.
         *   
         *   In any case, don't let our buffer fill up beyond its maximum
         *   size.  
         */
        if (!console_->allow_overrun() || linepos_ + 1 >= OS_MAXWIDTH)
        {
            /* 
             *   we didn't find any good place to break, and the console
             *   doesn't allow us to overrun the terminal width - flush the
             *   entire line as-is, breaking arbitrarily in the middle of a
             *   word 
             */
            flush_line(vmg_ FALSE);
            
            /* 
             *   we've completely cleared out the line buffer, so reset all
             *   of the line buffer counters 
             */
            linepos_ = 0;
            linecol_ = 0;
            linebuf_[0] = '\0';
            is_continuation_ = FALSE;
        }
    }
    else
    {
        wchar_t tmpbuf[OS_MAXWIDTH];
        vmcon_color_t tmpcolor[OS_MAXWIDTH];
        unsigned char tmpflags[OS_MAXWIDTH];
        size_t tmpchars;
        int nxti;

        /* null-terminate the line buffer */        
        linebuf_[linepos_] = '\0';

        /* trim off leading spaces on the next line after the break */
        for (nxti = i ; linebuf_[nxti] == ' ' ; ++nxti) ;

        /* 
         *   The next line starts after the break - save a copy.  We actually
         *   have to save a copy of the trailing material outside the buffer,
         *   since we might have to overwrite the trailing part of the buffer
         *   to expand tabs.  
         */
        tmpchars = wcslen(&linebuf_[nxti]);
        memcpy(tmpbuf, &linebuf_[nxti], tmpchars*sizeof(tmpbuf[0]));
        memcpy(tmpcolor, &colorbuf_[nxti], tmpchars*sizeof(tmpcolor[0]));
        memcpy(tmpflags, &flagbuf_[nxti], tmpchars*sizeof(tmpflags[0]));

        /* if we're breaking at a soft hyphen, insert a real hyphen */
        if (shy)
            linebuf_[i++] = '-';
        
        /* trim off trailing spaces */
        for ( ; i > 0 && linebuf_[i-1] == ' ' ; --i)
        {
            /* stop if we've reached a non-breaking point */
            if ((flagbuf_[i-1] & VMCON_OBF_NOBREAK) != 0)
                break;
        }

        /* terminate the buffer after the break point */
        linebuf_[i] = '\0';
        
        /* write out everything up to the break point */
        flush_line(vmg_ TRUE);

        /* move the saved start of the next line into the line buffer */
        memcpy(linebuf_, tmpbuf, tmpchars*sizeof(tmpbuf[0]));
        memcpy(colorbuf_, tmpcolor, tmpchars*sizeof(tmpcolor[0]));
        memcpy(flagbuf_, tmpflags, tmpchars*sizeof(tmpflags[0]));
        linecol_ = linepos_ = tmpchars;
    }
    
done_with_wrapping:
    /* add the new character to buffer */
    buffer_rendered(c, cflags, cwid);
}